

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLXContext glfwGetGLXContext(GLFWwindow *handle)

{
  _GLFWwindow *window;
  GLFWwindow *handle_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local = (GLFWwindow *)0x0;
  }
  else if (*(int *)(handle + 0x208) == 0) {
    _glfwInputError(0x1000a,(char *)0x0);
    handle_local = (GLFWwindow *)0x0;
  }
  else {
    handle_local = *(GLFWwindow **)(handle + 0x280);
  }
  return (GLXContext)handle_local;
}

Assistant:

GLFWAPI GLXContext glfwGetGLXContext(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return NULL;
    }

    return window->context.glx.handle;
}